

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadThings2(MapData *map)

{
  FMapThing *__s;
  short sVar1;
  ushort uVar2;
  FileReader *pFVar3;
  FMapThing *pFVar4;
  WORD WVar5;
  int j;
  void *buffer;
  FDoomEdEntry *pFVar6;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  
  pFVar3 = map->MapLumps[1].Reader;
  uVar12 = 0;
  if (pFVar3 == (FileReader *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (ulong)(int)pFVar3->Length;
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar9;
  uVar7 = SUB164(auVar13 / ZEXT816(0x14),0);
  TArray<FMapThing,_FMapThing>::Resize(&MapThingsConverted,uVar7);
  pFVar4 = MapThingsConverted.Array;
  buffer = operator_new__(uVar9);
  MapData::Read(map,1,buffer,-1);
  uVar9 = SUB168(auVar13 / ZEXT816(0x14),0) & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar9 = uVar12;
  }
  piVar8 = pFVar4->args;
  lVar10 = (long)buffer + 0xf;
  for (; uVar12 != uVar9; uVar12 = uVar12 + 1) {
    __s = pFVar4 + uVar12;
    memset(__s,0,0x90);
    lVar11 = uVar12 * 0x14;
    pFVar4[uVar12].thingid = (int)*(short *)((long)buffer + lVar11);
    auVar13 = ZEXT416(*(uint *)((long)buffer + lVar11 + 2));
    auVar13 = pshuflw(auVar13,auVar13,0x60);
    pFVar4[uVar12].pos.X = (double)(auVar13._0_4_ >> 0x10);
    pFVar4[uVar12].pos.Y = (double)(auVar13._4_4_ >> 0x10);
    pFVar4[uVar12].pos.Z = (double)(int)*(short *)((long)buffer + lVar11 + 6);
    pFVar4[uVar12].angle = *(short *)((long)buffer + lVar11 + 8);
    sVar1 = *(short *)((long)buffer + lVar11 + 10);
    pFVar4[uVar12].EdNum = sVar1;
    pFVar6 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                       (&DoomEdMap,(int)sVar1);
    pFVar4[uVar12].info = pFVar6;
    uVar2 = *(ushort *)((long)buffer + lVar11 + 0xc);
    pFVar4[uVar12].special = (uint)*(byte *)((long)buffer + lVar11 + 0xe);
    for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
      piVar8[lVar11] = (uint)*(byte *)(lVar10 + lVar11);
    }
    uVar7 = (uint)uVar2;
    WVar5 = MakeSkill(uVar7);
    __s->SkillFilter = WVar5;
    __s->ClassFilter = uVar2 >> 5 & 7;
    __s->flags = uVar7 & 0xff18;
    if ((level.flags2._2_1_ & 0x80) != 0) {
      __s->flags = uVar7 & 0x718;
    }
    __s->RenderStyle = 0xe;
    __s->FloatbobPhase = -1;
    __s->Gravity = 1.0;
    __s->Alpha = -1.0;
    __s->health = 1;
    piVar8 = piVar8 + 0x24;
    lVar10 = lVar10 + 0x14;
  }
  operator_delete__(buffer);
  return;
}

Assistant:

void P_LoadThings2 (MapData * map)
{
	int	lumplen = map->Size(ML_THINGS);
	int numthings = lumplen / sizeof(mapthinghexen_t);

	char *mtp;

	MapThingsConverted.Resize(numthings);
	FMapThing *mti = &MapThingsConverted[0];

	mtp = new char[lumplen];
	map->Read(ML_THINGS, mtp);
	mapthinghexen_t *mth = (mapthinghexen_t*)mtp;

	for(int i = 0; i< numthings; i++)
	{
		memset (&mti[i], 0, sizeof(mti[i]));

		mti[i].thingid = LittleShort(mth[i].thingid);
		mti[i].pos.X = LittleShort(mth[i].x);
		mti[i].pos.Y = LittleShort(mth[i].y);
		mti[i].pos.Z = LittleShort(mth[i].z);
		mti[i].angle = LittleShort(mth[i].angle);
		mti[i].EdNum = LittleShort(mth[i].type);
		mti[i].info = DoomEdMap.CheckKey(mti[i].EdNum);
		mti[i].flags = LittleShort(mth[i].flags);
		mti[i].special = mth[i].special;
		for(int j=0;j<5;j++) mti[i].args[j] = mth[i].args[j];
		mti[i].SkillFilter = MakeSkill(mti[i].flags);
		mti[i].ClassFilter = (mti[i].flags & MTF_CLASS_MASK) >> MTF_CLASS_SHIFT;
		mti[i].flags &= ~(MTF_SKILLMASK|MTF_CLASS_MASK);
		if (level.flags2 & LEVEL2_HEXENHACK)
		{
			mti[i].flags &= 0x7ff;	// mask out Strife flags if playing an original Hexen map.
		}

		mti[i].Gravity = 1;
		mti[i].RenderStyle = STYLE_Count;
		mti[i].Alpha = -1;
		mti[i].health = 1;
		mti[i].FloatbobPhase = -1;
	}
	delete[] mtp;
}